

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l1_norm(default_cost_type<double> *this,int n)

{
  bool bVar1;
  type pdVar2;
  unique_ptr<double[],_std::default_delete<double[]>_> *this_00;
  double dVar3;
  int local_28;
  int local_24;
  int i_1;
  int i;
  double div;
  int n_local;
  default_cost_type<double> *this_local;
  
  _i_1 = 0.0;
  for (local_24 = 0; local_24 != n; local_24 = local_24 + 1) {
    this_00 = &this->linear_elements;
    pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (this_00,(long)local_24);
    dVar3 = *pdVar2;
    std::abs((int)this_00);
    _i_1 = dVar3 + _i_1;
  }
  bVar1 = std::isnormal(_i_1);
  if (bVar1) {
    for (local_28 = 0; local_28 != n; local_28 = local_28 + 1) {
      pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)local_28);
      *pdVar2 = *pdVar2 / _i_1;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }